

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O1

ResolveResult * __thiscall
capnp::compiler::BrandedDecl::asResolveResult
          (ResolveResult *__return_storage_ptr__,BrandedDecl *this,uint64_t scopeId,
          Builder brandBuilder)

{
  byte bVar1;
  uint uVar2;
  BrandedDecl *pBVar3;
  ErrorReporter *errorReporter;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  Builder target;
  BrandScope **ppBVar9;
  RemoveConst<capnp::compiler::BrandScope_*> *ppBVar10;
  BrandScope **ppBVar11;
  ulong uVar12;
  ulong uVar13;
  size_t sVar14;
  BrandScope *pBVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  Vector<capnp::compiler::BrandScope_*> levels;
  Builder scope;
  Builder bindings;
  Builder scopes;
  Vector<capnp::compiler::BrandScope_*> local_158;
  ResolveResult *local_138;
  ulong local_130;
  ulong local_128;
  BrandScope *local_120;
  StructBuilder local_118;
  StructBuilder local_f0;
  undefined8 uStack_c8;
  PointerBuilder local_c0;
  StructBuilder local_a8;
  ListBuilder local_80;
  ListBuilder local_58;
  
  uVar2 = (this->body).tag;
  __return_storage_ptr__->tag = uVar2;
  if (uVar2 == 1) {
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) =
         *(undefined8 *)((long)&(this->body).field_1 + 0x20);
    uVar4 = *(undefined8 *)&(this->body).field_1;
    uVar5 = *(undefined8 *)((long)&(this->body).field_1 + 8);
    uVar6 = *(undefined8 *)((long)&(this->body).field_1 + 0x18);
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) =
         *(undefined8 *)((long)&(this->body).field_1 + 0x10);
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x18) = uVar6;
    *(undefined8 *)&__return_storage_ptr__->field_1 = uVar4;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 8) = uVar5;
    bVar1 = (this->body).field_1.space[0x28];
    (__return_storage_ptr__->field_1).space[0x28] = bVar1;
    if (bVar1 == '\x01') {
      uVar4 = *(undefined8 *)((long)&(this->body).field_1 + 0x30);
      uVar5 = *(undefined8 *)((long)&(this->body).field_1 + 0x38);
      uVar6 = *(undefined8 *)((long)&(this->body).field_1 + 0x40);
      uVar7 = *(undefined8 *)((long)&(this->body).field_1 + 0x48);
      uVar8 = *(undefined8 *)((long)&(this->body).field_1 + 0x58);
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x50) =
           *(undefined8 *)((long)&(this->body).field_1 + 0x50);
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x58) = uVar8;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x40) = uVar6;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x48) = uVar7;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = uVar4;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x38) = uVar5;
    }
  }
  if (uVar2 == 2) {
    uVar4 = *(undefined8 *)((long)&(this->body).field_1 + 8);
    *(undefined8 *)&__return_storage_ptr__->field_1 = *(undefined8 *)&(this->body).field_1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 8) = uVar4;
  }
  if (uVar2 == 1) {
    *(uint64_t *)((long)&__return_storage_ptr__->field_1 + 0x10) = scopeId;
    pBVar15 = (this->brand).ptr;
    local_158.builder.ptr = (BrandScope **)0x0;
    local_158.builder.pos = (BrandScope **)0x0;
    local_158.builder.endPtr = (BrandScope **)0x0;
    local_158.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
    local_138 = __return_storage_ptr__;
    local_120 = pBVar15;
    do {
      if (((pBVar15->params).size_ != 0) ||
         ((pBVar15->inherited == true && (pBVar15->leafParamCount != 0)))) {
        if (local_158.builder.pos == local_158.builder.endPtr) {
          sVar14 = (long)local_158.builder.endPtr - (long)local_158.builder.ptr >> 2;
          if (local_158.builder.endPtr == local_158.builder.ptr) {
            sVar14 = 4;
          }
          kj::Vector<capnp::compiler::BrandScope_*>::setCapacity(&local_158,sVar14);
        }
        *local_158.builder.pos = pBVar15;
        local_158.builder.pos = local_158.builder.pos + 1;
      }
      pBVar15 = (pBVar15->parent).ptr.ptr;
    } while (pBVar15 != (BrandScope *)0x0);
    if (local_158.builder.pos != local_158.builder.ptr) {
      capnp::_::StructBuilder::asReader(&brandBuilder._builder);
      if ((__return_storage_ptr__->field_1).space[0x28] == '\x01') {
        (__return_storage_ptr__->field_1).space[0x28] = '\0';
      }
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x50) = local_f0._32_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x58) = uStack_c8;
      *(void **)((long)&__return_storage_ptr__->field_1 + 0x40) = local_f0.data;
      *(WirePointer **)((long)&__return_storage_ptr__->field_1 + 0x48) = local_f0.pointers;
      *(SegmentBuilder **)((long)&__return_storage_ptr__->field_1 + 0x30) = local_f0.segment;
      *(CapTableBuilder **)((long)&__return_storage_ptr__->field_1 + 0x38) = local_f0.capTable;
      (__return_storage_ptr__->field_1).space[0x28] = '\x01';
      local_f0.segment = brandBuilder._builder.segment;
      local_f0.capTable = brandBuilder._builder.capTable;
      local_f0.data = brandBuilder._builder.pointers;
      capnp::_::PointerBuilder::initStructList
                (&local_58,(PointerBuilder *)&local_f0,
                 (ElementCount)
                 ((ulong)((long)local_158.builder.pos - (long)local_158.builder.ptr) >> 3),
                 (StructSize)0x10002);
      if ((long)local_158.builder.pos - (long)local_158.builder.ptr != 0) {
        uVar12 = (long)local_158.builder.pos - (long)local_158.builder.ptr >> 3;
        uVar19 = 0;
        local_130 = uVar12;
        do {
          capnp::_::ListBuilder::getStructElement(&local_f0,&local_58,(ElementCount)uVar19);
          uVar13 = uVar19 & 0xffffffff;
          pBVar15 = local_158.builder.ptr[uVar13];
          *(uint64_t *)local_f0.data = pBVar15->leafId;
          if (pBVar15->inherited == true) {
            *(undefined2 *)&(((WirePointer *)((long)local_f0.data + 8))->offsetAndKind).value = 1;
          }
          else {
            sVar14 = (local_158.builder.ptr[uVar13]->params).size_;
            *(undefined2 *)&(((WirePointer *)((long)local_f0.data + 8))->offsetAndKind).value = 0;
            local_118.segment = local_f0.segment;
            local_118.capTable = local_f0.capTable;
            local_118.data = local_f0.pointers;
            local_128 = uVar19;
            capnp::_::PointerBuilder::initStructList
                      (&local_80,(PointerBuilder *)&local_118,(ElementCount)sVar14,
                       (StructSize)0x10001);
            uVar17 = (ulong)local_80.elementCount;
            uVar12 = local_130;
            __return_storage_ptr__ = local_138;
            uVar19 = local_128;
            if (uVar17 != 0) {
              lVar18 = 0;
              uVar16 = 0;
              do {
                pBVar3 = (local_158.builder.ptr[uVar13]->params).ptr;
                errorReporter = local_120->errorReporter;
                capnp::_::ListBuilder::getStructElement(&local_118,&local_80,(ElementCount)uVar16);
                *(undefined2 *)&((WireValue<uint32_t> *)local_118.data)->value = 1;
                local_c0.segment = local_118.segment;
                local_c0.capTable = local_118.capTable;
                local_c0.pointer = local_118.pointers;
                capnp::_::PointerBuilder::initStruct(&local_a8,&local_c0,(StructSize)0x10003);
                target._builder.capTable = local_a8.capTable;
                target._builder.segment = local_a8.segment;
                target._builder.data = local_a8.data;
                target._builder.pointers = local_a8.pointers;
                target._builder.dataSize = local_a8.dataSize;
                target._builder.pointerCount = local_a8.pointerCount;
                target._builder._38_2_ = local_a8._38_2_;
                compileAsType((BrandedDecl *)((long)&(pBVar3->body).tag + lVar18),errorReporter,
                              target);
                uVar16 = uVar16 + 1;
                lVar18 = lVar18 + 0xa8;
                uVar12 = local_130;
                __return_storage_ptr__ = local_138;
                uVar19 = local_128;
              } while (uVar17 != uVar16);
            }
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar12);
      }
    }
    ppBVar11 = local_158.builder.endPtr;
    ppBVar10 = local_158.builder.pos;
    ppBVar9 = local_158.builder.ptr;
    if (local_158.builder.ptr != (BrandScope **)0x0) {
      local_158.builder.ptr = (BrandScope **)0x0;
      local_158.builder.pos = (RemoveConst<capnp::compiler::BrandScope_*> *)0x0;
      local_158.builder.endPtr = (BrandScope **)0x0;
      (**(local_158.builder.disposer)->_vptr_ArrayDisposer)
                (local_158.builder.disposer,ppBVar9,8,(long)ppBVar10 - (long)ppBVar9 >> 3,
                 (long)ppBVar11 - (long)ppBVar9 >> 3,0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Resolver::ResolveResult BrandedDecl::asResolveResult(
    uint64_t scopeId, schema::Brand::Builder brandBuilder) {
  auto result = body;
  if (result.is<Resolver::ResolvedDecl>()) {
    // May need to compile our context as the "brand".

    result.get<Resolver::ResolvedDecl>().scopeId = scopeId;

    getIdAndFillBrand([&]() {
      result.get<Resolver::ResolvedDecl>().brand = brandBuilder.asReader();
      return brandBuilder;
    });
  }
  return result;
}